

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::SetColumnComment
          (DuckTableEntry *this,ClientContext *context,SetColumnCommentInfo *info)

{
  Catalog *args;
  SchemaCatalogEntry *args_1;
  ClientConfig *pCVar1;
  ClientContext *pCVar2;
  pointer pCVar3;
  LogicalIndex LVar4;
  ColumnDefinition *this_00;
  LogicalIndex LVar5;
  reference this_01;
  pointer pCVar6;
  Binder *info_00;
  type args_2;
  CatalogException *this_02;
  idx_t in_RCX;
  ulong __n;
  ColumnListIterator CVar7;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_260;
  ClientContext *local_258;
  undefined1 local_250 [16];
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  _Alloc_hider local_230;
  __buckets_ptr local_228;
  ColumnLogicalIteratorInternal __end1;
  ColumnListIterator local_1f0;
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnDefinition local_108;
  
  local_250._8_8_ = in_RCX;
  make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
            ((duckdb *)&local_260,
             *(SchemaCatalogEntry **)&(context->config).query_verification_enabled,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &context->interrupted);
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_260);
  Value::operator=(&(pCVar3->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_260);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar3->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(context->config).profiler_settings._M_h._M_before_begin);
  local_258 = context;
  LVar4 = TableCatalogEntry::GetColumnIndex
                    ((TableCatalogEntry *)context,(string *)(local_250._8_8_ + 0x78),false);
  if (LVar4.index != 0xffffffffffffffff) {
    CVar7 = ColumnList::Logical((ColumnList *)&(local_258->config).asof_loop_join_threshold);
    local_1f0.list = CVar7.list;
    local_1f0.physical = CVar7.physical;
    ColumnList::ColumnListIterator::begin
              ((ColumnLogicalIteratorInternal *)&bound_create_info,&local_1f0);
    ColumnList::ColumnListIterator::end(&__end1,&local_1f0);
    local_250._8_8_ = local_250._8_8_ + 0x98;
    while (((local_230._M_p != (pointer)__end1.pos || (local_228 != (__buckets_ptr)__end1.end)) ||
           (bound_create_info.
            super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl !=
            (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
             )__end1.list))) {
      this_00 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                          ((ColumnLogicalIteratorInternal *)&bound_create_info);
      ColumnDefinition::Copy((ColumnDefinition *)&binder,this_00);
      LVar5 = ColumnDefinition::Logical(this_00);
      if (LVar4.index == LVar5.index) {
        ColumnDefinition::SetComment((ColumnDefinition *)&binder,(Value *)local_250._8_8_);
      }
      pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_260);
      ColumnDefinition::ColumnDefinition(&local_108,(ColumnDefinition *)&binder);
      ColumnList::AddColumn(&pCVar3->columns,&local_108);
      ColumnDefinition::~ColumnDefinition(&local_108);
      ColumnDefinition::~ColumnDefinition((ColumnDefinition *)&binder);
      local_230._M_p = local_230._M_p + 1;
    }
    pCVar1 = &local_258->config;
    for (__n = 0; __n < (ulong)((long)((long)(local_258->config).set_variables._M_h._M_single_bucket
                                      - (local_258->config).set_variables._M_h._M_rehash_policy.
                                        _M_next_resize) >> 3); __n = __n + 1) {
      this_01 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                             *)&(pCVar1->set_variables)._M_h._M_rehash_policy._M_next_resize,__n);
      pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_01);
      (*pCVar6->_vptr_Constraint[3])(&binder,pCVar6);
      pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_260);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar3->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 &binder);
      if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*(code *)((((binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
    }
    Binder::CreateBinder
              ((Binder *)&binder,(ClientContext *)info,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
    info_00 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
    local_250._0_8_ = local_260._M_head_impl;
    local_260._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)&bound_create_info,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               info_00,(SchemaCatalogEntry *)local_250);
    if ((CreateTableInfo *)local_250._0_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_250._0_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    pCVar2 = local_258;
    local_250._0_8_ = (_func_int **)0x0;
    args = (Catalog *)(local_258->config).max_expression_depth;
    args_1 = *(SchemaCatalogEntry **)&(local_258->config).query_verification_enabled;
    args_2 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
             ::operator*(&bound_create_info);
    make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
              ((duckdb *)&__end1,args,args_1,args_2,
               (shared_ptr<duckdb::DataTable,_true> *)
               &(pCVar2->config).user_variables._M_h._M_bucket_count);
    (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)__end1.list;
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr(&bound_create_info.
                 super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_260._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_260._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
  }
  this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&binder,"Cannot SET DEFAULT for rowid column",(allocator *)&bound_create_info
            );
  CatalogException::CatalogException(this_02,(string *)&binder);
  __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::SetColumnComment(ClientContext &context, SetColumnCommentInfo &info) {
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->comment = comment;
	create_info->tags = tags;
	auto default_idx = GetColumnIndex(info.column_name);
	if (default_idx.index == COLUMN_IDENTIFIER_ROW_ID) {
		throw CatalogException("Cannot SET DEFAULT for rowid column");
	}

	// Copy all the columns, changing the value of the one that was specified by 'column_name'
	for (auto &col : columns.Logical()) {
		auto copy = col.Copy();
		if (default_idx == col.Logical()) {
			copy.SetComment(info.comment_value);
		}
		create_info->columns.AddColumn(std::move(copy));
	}
	// Copy all the constraints
	for (idx_t i = 0; i < constraints.size(); i++) {
		auto constraint = constraints[i]->Copy();
		create_info->constraints.push_back(std::move(constraint));
	}

	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}